

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_helper.c
# Opt level: O0

hwaddr riscv_cpu_get_phys_page_debug_riscv32(CPUState_conflict *cs,vaddr addr)

{
  hwaddr env_00;
  _Bool _Var1;
  int iVar2;
  target_ulong_conflict addr_00;
  int iVar3;
  int local_3c;
  int mmu_idx;
  int prot;
  hwaddr phys_addr;
  CPURISCVState_conflict *env;
  RISCVCPU *cpu;
  vaddr addr_local;
  CPUState_conflict *cs_local;
  
  phys_addr = (hwaddr)(cs[1].tb_jmp_cache + 0x13f);
  env = (CPURISCVState_conflict *)cs;
  cpu = (RISCVCPU *)addr;
  addr_local = (vaddr)cs;
  iVar2 = riscv_cpu_mmu_index_riscv32((CPURISCVState_conflict *)(cs[1].tb_jmp_cache + 0x13f),false);
  env_00 = phys_addr;
  addr_00 = (target_ulong_conflict)cpu;
  _Var1 = riscv_cpu_virt_enabled_riscv32((CPURISCVState_conflict *)phys_addr);
  iVar3 = get_physical_address
                    ((CPURISCVState_conflict *)env_00,(hwaddr *)&mmu_idx,&local_3c,addr_00,0,iVar2,
                     true,_Var1);
  if (iVar3 == 0) {
    _Var1 = riscv_cpu_virt_enabled_riscv32((CPURISCVState_conflict *)phys_addr);
    if ((_Var1) &&
       (iVar2 = get_physical_address
                          ((CPURISCVState_conflict *)phys_addr,(hwaddr *)&mmu_idx,&local_3c,
                           (target_ulong_conflict)_mmu_idx,0,iVar2,false,true), iVar2 != 0)) {
      cs_local = (CPUState_conflict *)0xffffffffffffffff;
    }
    else {
      cs_local = _mmu_idx;
    }
  }
  else {
    cs_local = (CPUState_conflict *)0xffffffffffffffff;
  }
  return (hwaddr)cs_local;
}

Assistant:

hwaddr riscv_cpu_get_phys_page_debug(CPUState *cs, vaddr addr)
{
    RISCVCPU *cpu = RISCV_CPU(cs);
    CPURISCVState *env = &cpu->env;
    hwaddr phys_addr;
    int prot;
    int mmu_idx = cpu_mmu_index(&cpu->env, false);

    if (get_physical_address(env, &phys_addr, &prot, addr, 0, mmu_idx,
                             true, riscv_cpu_virt_enabled(env))) {
        return -1;
    }

    if (riscv_cpu_virt_enabled(env)) {
        if (get_physical_address(env, &phys_addr, &prot, phys_addr,
                                 0, mmu_idx, false, true)) {
            return -1;
        }
    }

    return phys_addr;
}